

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O2

bool __thiscall ForbiddenPointFinder::isDoubleThree(ForbiddenPointFinder *this,int x,int y)

{
  bool bVar1;
  uint uVar2;
  int i;
  int nDir;
  
  if (this->cBoard[x + 1][(long)y + 1] == Empty) {
    uVar2 = 0;
    bVar1 = isFive(this,x,y,0);
    if (!bVar1) {
      for (nDir = 1; nDir != 5; nDir = nDir + 1) {
        bVar1 = isOpenThree(this,x,y,0,nDir);
        uVar2 = uVar2 + bVar1;
      }
      uVar2 = (uint)(1 < uVar2);
    }
  }
  else {
    uVar2 = 0;
  }
  return SUB41(uVar2,0);
}

Assistant:

bool ForbiddenPointFinder::isDoubleThree(int x, int y) {
    if (cBoard[x + 1][y + 1] != Stone::Empty)
        return false;

    if (isFive(x, y, 0))    // five?
        return false;

    int nThree = 0;
    for (int i = 1; i <= 4; i++) {
        if (isOpenThree(x, y, 0, i))
            nThree++;
    }

    if (nThree >= 2)
        return true;
    else
        return false;
}